

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall Image::saveToPPM(Image *this,char *filename)

{
  ostream *poVar1;
  float *pfVar2;
  float fVar3;
  float local_268;
  float local_264;
  float local_260;
  uchar local_259;
  float local_258;
  float fStack_254;
  uchar b;
  float local_250;
  uchar local_249;
  float local_248;
  float fStack_244;
  uchar g;
  float local_240;
  uchar local_239;
  int local_238;
  int iStack_234;
  uchar r;
  int i;
  int j;
  float *pixel;
  ostream local_218 [8];
  ofstream ofs;
  char *filename_local;
  Image *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  poVar1 = std::operator<<(local_218,"P6\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->width);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  std::operator<<(poVar1,"\n255\n");
  _i = this->imageData;
  for (iStack_234 = 0; iStack_234 < this->height; iStack_234 = iStack_234 + 1) {
    for (local_238 = 0; local_238 < this->width; local_238 = local_238 + 1) {
      local_240 = 0.0;
      fStack_244 = 255.0;
      fVar3 = powf(*_i,0.45454547);
      local_248 = fVar3 * 255.0 + 0.5;
      pfVar2 = std::min<float>(&stack0xfffffffffffffdbc,&local_248);
      pfVar2 = std::max<float>(&local_240,pfVar2);
      local_239 = (uchar)(int)*pfVar2;
      local_250 = 0.0;
      fStack_254 = 255.0;
      fVar3 = powf(_i[1],0.45454547);
      local_258 = fVar3 * 255.0 + 0.5;
      pfVar2 = std::min<float>(&stack0xfffffffffffffdac,&local_258);
      pfVar2 = std::max<float>(&local_250,pfVar2);
      local_249 = (uchar)(int)*pfVar2;
      local_260 = 0.0;
      local_264 = 255.0;
      fVar3 = powf(_i[2],0.45454547);
      local_268 = fVar3 * 255.0 + 0.5;
      pfVar2 = std::min<float>(&local_264,&local_268);
      pfVar2 = std::max<float>(&local_260,pfVar2);
      local_259 = (uchar)(int)*pfVar2;
      poVar1 = std::operator<<(local_218,local_239);
      poVar1 = std::operator<<(poVar1,local_249);
      std::operator<<(poVar1,local_259);
      _i = _i + 3;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Image::saveToPPM(const char *filename) {
    std::ofstream ofs;
        ofs.open(filename);
        ofs << "P6\n" << width << " " << height << "\n255\n";
        float *pixel = imageData;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                unsigned char r = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[0], 1/2.2) * 255 + 0.5f)));
                unsigned char g = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[1], 1/2.2) * 255 + 0.5f)));
                unsigned char b = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[2], 1/2.2) * 255 + 0.5f)));
                ofs << r << g << b;
                pixel += 3;
            }
        }
        ofs.close();
}